

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

t_operand __thiscall
xemmai::ast::t_lambda::f_emit(t_lambda *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  size_t sVar1;
  vector<bool,_std::allocator<bool>_> *pvVar2;
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *pdVar3;
  t_targets *ptVar4;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *pvVar5;
  pointer puVar6;
  __uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> _Var7;
  t_scope *ptVar8;
  t_code *ptVar9;
  t_object *a_operand_00;
  t_label *ptVar10;
  t_emit *ptVar11;
  ulong uVar12;
  size_t sVar13;
  size_t sVar14;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  size_t i;
  ulong uVar15;
  t_instruction a_instruction;
  size_t i_1;
  bool bVar16;
  t_operand tVar17;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  safe_positions1;
  vector<bool,_std::allocator<bool>_> privates1;
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> labels1;
  t_targets local_88;
  
  a_operand_00 = f_code(this,a_emit->v_module);
  ptVar8 = a_emit->v_scope;
  ptVar9 = a_emit->v_code;
  a_emit->v_scope = &this->super_t_scope;
  a_emit->v_code = (t_code *)a_operand_00->v_data;
  sVar14 = a_emit->v_arguments;
  sVar1 = this->v_arguments;
  a_emit->v_arguments = sVar1;
  pvVar2 = a_emit->v_privates;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&privates1,
             ((long)(this->super_t_scope).v_privates.
                    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_t_scope).v_privates.
                    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - sVar1,
             (allocator_type *)&labels1);
  a_emit->v_privates = &privates1;
  sVar1 = a_emit->v_stack;
  pdVar3 = a_emit->v_labels;
  a_emit->v_stack =
       (long)(this->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  std::_Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::_Deque_base
            (&labels1.
              super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>);
  a_emit->v_labels =
       (deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *)
       &labels1.super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>
  ;
  ptVar4 = a_emit->v_targets;
  ptVar10 = t_emit::f_label(a_emit);
  local_88.v_break = (t_label *)0x0;
  local_88.v_break_junction = (t_block *)0x0;
  local_88.v_break_stack = a_emit->v_stack;
  local_88.v_break_is_tail = false;
  local_88.v_break_must_clear = false;
  local_88.v_continue = (t_label *)0x0;
  local_88.v_continue_junction = (t_block *)0x0;
  local_88.v_return_junction = &(this->super_t_scope).v_junction;
  local_88.v_return_is_tail = true;
  a_emit->v_targets = &local_88;
  pvVar5 = a_emit->v_safe_positions;
  safe_positions1.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  safe_positions1.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  safe_positions1.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a_emit->v_safe_positions = &safe_positions1;
  local_88.v_return = ptVar10;
  local_88.v_return_stack = local_88.v_break_stack;
  if ((this->super_t_scope).v_self_shared != false) {
    ptVar11 = t_emit::operator<<(a_emit,c_instruction__SELF);
    ptVar11 = t_emit::operator<<(ptVar11,a_emit->v_stack);
    ptVar11 = t_emit::operator<<(ptVar11,c_instruction__SCOPE_PUT0);
    ptVar11 = t_emit::operator<<(ptVar11,a_emit->v_stack);
    t_emit::operator<<(ptVar11,0);
  }
  for (uVar15 = 0; uVar15 < this->v_arguments; uVar15 = uVar15 + 1) {
    if ((this->super_t_scope).v_privates.
        super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar15]->v_shared == true) {
      ptVar11 = t_emit::operator<<(a_emit,c_instruction__STACK_GET);
      ptVar11 = t_emit::operator<<(ptVar11,a_emit->v_stack);
      ptVar11 = t_emit::operator<<(ptVar11,uVar15);
      ptVar11 = t_emit::operator<<(ptVar11,c_instruction__SCOPE_PUT0);
      ptVar11 = t_emit::operator<<(ptVar11,a_emit->v_stack);
      t_emit::operator<<(ptVar11,(this->super_t_scope).v_privates.
                                 super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar15]->v_index);
    }
  }
  anon_unknown_11::f_emit_block(a_emit,&(this->super_t_scope).v_block,true,false,false);
  sVar13 = a_emit->v_stack - 1;
  a_emit->v_stack = sVar13;
  ptVar10->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  if (sVar13 == (long)(this->super_t_scope).v_privates.
                      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_t_scope).v_privates.
                      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) {
    t_emit::operator<<(a_emit,c_instruction__RETURN_T);
    t_emit::f_resolve(a_emit);
    a_emit->v_scope = ptVar8;
    a_emit->v_code = ptVar9;
    a_emit->v_arguments = sVar14;
    a_emit->v_privates = pvVar2;
    a_emit->v_stack = sVar1;
    a_emit->v_labels = pdVar3;
    a_emit->v_targets = ptVar4;
    a_emit->v_safe_positions = pvVar5;
    if (a_emit->v_safe_points !=
        (map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
         *)0x0) {
      f_safe_points(this,(t_code *)a_operand_00->v_data,a_emit->v_safe_points,&safe_positions1);
    }
    t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
    if ((this->v_variadic == false) &&
       ((this->v_defaults).
        super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->v_defaults).
        super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      a_instruction = c_instruction__LAMBDA;
    }
    else {
      uVar15 = 0;
      while( true ) {
        puVar6 = (this->v_defaults).
                 super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(this->v_defaults).
                       super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3;
        if (uVar12 <= uVar15) break;
        _Var7._M_t.
        super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
        super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl =
             puVar6[uVar15]._M_t.
             super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
             _M_t;
        (**(code **)(*(long *)_Var7._M_t.
                              super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                              .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl +
                    0x18))(_Var7._M_t.
                           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                           .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl,a_emit,
                           0,0,0);
        uVar15 = uVar15 + 1;
      }
      sVar14 = a_emit->v_stack;
      a_instruction = c_instruction__ADVANCED_LAMBDA;
      while( true ) {
        sVar14 = sVar14 - 1;
        bVar16 = uVar12 == 0;
        uVar12 = uVar12 - 1;
        if (bVar16) break;
        a_emit->v_stack = sVar14;
      }
    }
    t_emit::operator<<(a_emit,a_instruction);
    ptVar11 = t_emit::operator<<(a_emit,a_emit->v_stack);
    ptVar11 = t_emit::operator<<(ptVar11,a_operand_00);
    t_emit::f_push(ptVar11);
    if (a_clear) {
      a_emit->v_stack = a_emit->v_stack - 1;
    }
    std::
    _Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
    ::~_Vector_base(&safe_positions1.
                     super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                   );
    std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::~deque(&labels1);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&privates1.super__Bvector_base<std::allocator<bool>_>);
    tVar17.field_1.v_integer = extraout_RDX.v_integer;
    tVar17._0_8_ = 4;
    return tVar17;
  }
  __assert_fail("a_emit.v_stack == v_privates.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/ast.cc"
                ,0xa9,"virtual t_operand xemmai::ast::t_lambda::f_emit(t_emit &, bool, bool, bool)")
  ;
}

Assistant:

t_operand t_lambda::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	auto code = f_code(a_emit.v_module);
	auto& code1 = code->f_as<t_code>();
	auto scope0 = a_emit.v_scope;
	a_emit.v_scope = this;
	auto code0 = a_emit.v_code;
	a_emit.v_code = &code1;
	auto arguments0 = a_emit.v_arguments;
	a_emit.v_arguments = v_arguments;
	auto privates0 = a_emit.v_privates;
	std::vector<bool> privates1(v_privates.size() - v_arguments);
	a_emit.v_privates = &privates1;
	auto stack0 = a_emit.v_stack;
	a_emit.v_stack = v_privates.size();
	auto labels0 = a_emit.v_labels;
	std::deque<t_emit::t_label> labels1;
	a_emit.v_labels = &labels1;
	auto targets0 = a_emit.v_targets;
	auto& return0 = a_emit.f_label();
	t_emit::t_targets targets1{nullptr, nullptr, a_emit.v_stack, false, false, nullptr, nullptr, &return0, &v_junction, a_emit.v_stack, true};
	a_emit.v_targets = &targets1;
	auto safe_positions0 = a_emit.v_safe_positions;
	std::vector<std::tuple<size_t, size_t, size_t>> safe_positions1;
	a_emit.v_safe_positions = &safe_positions1;
	if (v_self_shared) a_emit
		<< c_instruction__SELF << a_emit.v_stack
		<< c_instruction__SCOPE_PUT0 << a_emit.v_stack << 0;
	for (size_t i = 0; i < v_arguments; ++i)
		if (v_privates[i]->v_shared) a_emit
			<< c_instruction__STACK_GET << a_emit.v_stack << i
			<< c_instruction__SCOPE_PUT0 << a_emit.v_stack << v_privates[i]->v_index;
	f_emit_block(a_emit, v_block, true, false);
	a_emit.f_pop();
	a_emit.f_target(return0);
	assert(a_emit.v_stack == v_privates.size());
	a_emit << c_instruction__RETURN_T;
	a_emit.f_resolve();
	a_emit.v_scope = scope0;
	a_emit.v_code = code0;
	a_emit.v_arguments = arguments0;
	a_emit.v_privates = privates0;
	a_emit.v_stack = stack0;
	a_emit.v_labels = labels0;
	a_emit.v_targets = targets0;
	a_emit.v_safe_positions = safe_positions0;
	if (a_emit.v_safe_points) f_safe_points(code1, *a_emit.v_safe_points, safe_positions1);
	a_emit.f_emit_safe_point(this);
	if (v_variadic || v_defaults.size() > 0) {
		for (size_t i = 0; i < v_defaults.size(); ++i) v_defaults[i]->f_emit(a_emit, false, false);
		for (size_t i = 0; i < v_defaults.size(); ++i) a_emit.f_pop();
		a_emit << c_instruction__ADVANCED_LAMBDA;
	} else {
		a_emit << c_instruction__LAMBDA;
	}
	(a_emit << a_emit.v_stack << code).f_push();
	if (a_clear) a_emit.f_pop();
	return {};
}